

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::namemorestring(Forth *this)

{
  Cell dst;
  uint index;
  size_type sVar1;
  Definition *pDVar2;
  char *src;
  size_type sVar3;
  string *this_00;
  string *name;
  Definition *defn;
  uint nt;
  Forth *this_local;
  
  requireDStackDepth(this,1,"NAME>STRING");
  index = ForthStack<unsigned_int>::getTop(&this->dStack);
  sVar1 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
          size(&this->definitions);
  if (index < sVar1) {
    pDVar2 = getDefinition(this,index);
    this_00 = &pDVar2->name;
    dst = this->VarOffsetWordBuffer;
    src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    (this_00);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (this_00);
    moveIntoDataSpace(this,dst,src,sVar3);
    ForthStack<unsigned_int>::setTop(&this->dStack,this->VarOffsetWordBuffer);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (this_00);
    ForthStack<unsigned_int>::push(&this->dStack,(uint)sVar3);
  }
  else {
    ForthStack<unsigned_int>::setTop(&this->dStack,this->VarOffsetWordBuffer);
    ForthStack<unsigned_int>::push(&this->dStack,0);
  }
  return;
}

Assistant:

void namemorestring(){
			REQUIRE_DSTACK_DEPTH(1, "NAME>STRING");
			auto nt=dStack.getTop();
			if(nt>=0 && nt<definitions.size()){
			auto defn=getDefinition(nt);
			auto &name=defn->name;
			moveIntoDataSpace(VarOffsetWordBuffer,name.c_str(),name.size());
			dStack.setTop(VarOffsetWordBuffer);
			dStack.push(CELL(name.size()));
			} else {
				dStack.setTop(VarOffsetWordBuffer);
				dStack.push(0);
			}
		}